

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O2

void __thiscall xray_re::xr_surface::load_1(xr_surface *this,xr_reader *r)

{
  uint32_t *puVar1;
  uint *puVar2;
  
  xr_reader::r_sz(r,&this->m_name);
  xr_reader::r_sz(r,&this->m_eshader);
  xr_reader::r_sz(r,&this->m_cshader);
  std::__cxx11::string::assign((char *)&this->m_gamemtl);
  xr_reader::r_sz(r,&this->m_texture);
  xr_reader::r_sz(r,&this->m_vmap);
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->m_flags = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->m_fvf = *puVar1;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  if (*puVar2 < 2) {
    return;
  }
  __assert_fail("tc <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_surface.cxx"
                ,0x2b,"void xray_re::xr_surface::load_1(xr_reader &)");
}

Assistant:

void xr_surface::load_1(xr_reader& r)
{
	r.r_sz(m_name);
	r.r_sz(m_eshader);
	r.r_sz(m_cshader);
	m_gamemtl = "default";
	r.r_sz(m_texture);
	r.r_sz(m_vmap);
	m_flags = r.r_u32();
	m_fvf = r.r_u32();
	unsigned tc = r.r_u32();
	xr_assert(tc <= 1);
}